

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_shape.c
# Opt level: O3

void CGTFS_DatabaseShape(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  long lVar3;
  char *pcVar4;
  shape_t *psVar5;
  byte bVar6;
  feed_db_t db;
  feed_db_t local_d0;
  shape_t local_a8;
  
  bVar6 = 0;
  iVar1 = greatest_test_pre("db_shape_store");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pcVar4 = "some shape id";
      psVar5 = &local_a8;
      for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)psVar5->id = *(undefined8 *)pcVar4;
        pcVar4 = pcVar4 + ((ulong)bVar6 * -2 + 1) * 8;
        psVar5 = (shape_t *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      init_feed_db(&local_d0,"tests_tdw0.db",1);
      setup_feed_db(&local_d0);
      fVar2 = store_shape_db(&local_a8,&local_d0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db(&local_d0);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_shape.c"
        ;
        greatest_info.fail_line = 0x17;
        greatest_info.msg = local_d0.error_msg;
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseShape) {
    RUN_TEST(db_shape_store);
}